

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-collective.hpp
# Opt level: O0

void diy::detail::decide_move_info
               (vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *all_work_info
               ,vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *all_move_info
               )

{
  undefined4 uVar1;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  *this;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  *ppVar2;
  value_type *__x;
  value_type *pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *in_RDI;
  value_type work_info;
  MoveInfo move_info;
  value_type dst_work_info;
  value_type src_work_info;
  int i_1;
  int i;
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
  min_proc_work_q;
  anon_class_1_0_00000001 cmp;
  vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *in_stack_ffffffffffffff08;
  vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *in_stack_ffffffffffffff20;
  value_type *__x_00;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  MoveInfo local_b8;
  undefined8 local_ac;
  undefined8 local_a4;
  int local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  int local_88;
  int local_80;
  WorkInfo *local_78;
  WorkInfo *local_70;
  int local_68;
  undefined1 local_58 [80];
  vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *local_8;
  
  local_8 = in_RDI;
  Catch::clara::std::vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>::clear
            ((vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *)0x25c2e4);
  local_58._0_4_ = 0;
  local_58._4_4_ = 0;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0;
  local_58._16_8_ = 0;
  __x_00 = (value_type *)local_58;
  Catch::clara::std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::vector
            ((vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *)0x25c30d);
  Catch::clara::std::
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
  ::priority_queue((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (anon_class_1_0_00000001 *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  Catch::clara::std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::~vector
            (in_stack_ffffffffffffff20);
  local_68 = 0;
  while( true ) {
    this = (priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
            *)(long)local_68;
    ppVar2 = (priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
              *)Catch::clara::std::
                vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::size(local_8)
    ;
    if (ppVar2 <= this) break;
    Catch::clara::std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::
    operator[](local_8,(long)local_68);
    Catch::clara::std::
    priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
    ::push((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
            *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),__x_00);
    local_68 = local_68 + 1;
  }
  local_70 = (WorkInfo *)
             Catch::clara::std::
             vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::begin
                       (in_stack_ffffffffffffff08);
  local_78 = (WorkInfo *)
             Catch::clara::std::
             vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::end
                       (in_stack_ffffffffffffff08);
  std::
  sort<__gnu_cxx::__normal_iterator<diy::detail::WorkInfo*,std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>>,diy::detail::decide_move_info(std::vector<diy::detail::WorkInfo,std::allocator<diy::detail::WorkInfo>>&,std::vector<diy::detail::MoveInfo,std::allocator<diy::detail::MoveInfo>>&)::_lambda(diy::detail::WorkInfo&,diy::detail::WorkInfo&)_2_>
            (local_70,local_78);
  local_80 = 0;
  while( true ) {
    __x = (value_type *)(long)local_80;
    pvVar3 = (value_type *)
             Catch::clara::std::
             vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::size(local_8);
    if (pvVar3 <= __x) break;
    pvVar4 = Catch::clara::std::
             vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>::operator[]
                       (local_8,(long)local_80);
    local_88 = pvVar4->nlids;
    local_98._0_4_ = pvVar4->proc_rank;
    local_98._4_4_ = pvVar4->top_gid;
    uStack_90._0_4_ = pvVar4->top_work;
    uStack_90._4_4_ = pvVar4->proc_work;
    pvVar5 = Catch::clara::std::
             priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
             ::top((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
                    *)0x25c493);
    local_ac._0_4_ = pvVar5->proc_rank;
    local_ac._4_4_ = pvVar5->top_gid;
    local_a4._0_4_ = pvVar5->top_work;
    local_a4._4_4_ = pvVar5->proc_work;
    local_9c = pvVar5->nlids;
    if ((uint)uStack_90 < (uint)(uStack_90._4_4_ - local_a4._4_4_)) {
      if (((int)local_98 != (int)local_ac) && (1 < local_88)) {
        MoveInfo::MoveInfo(&local_b8);
        local_b8.src_proc = (int)local_98;
        local_b8.dst_proc = (int)local_ac;
        local_b8.move_gid = local_98._4_4_;
        Catch::clara::std::vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_>::
        push_back((vector<diy::detail::MoveInfo,_std::allocator<diy::detail::MoveInfo>_> *)this,__x)
        ;
        pvVar5 = Catch::clara::std::
                 priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
                 ::top((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
                        *)0x25c527);
        uVar1 = pvVar5->proc_rank;
        Catch::clara::std::
        priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
        ::pop(this);
        Catch::clara::std::
        priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
        ::push((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
                *)CONCAT44(uVar1,in_stack_ffffffffffffff30),__x_00);
      }
    }
    local_80 = local_80 + 1;
  }
  Catch::clara::std::
  priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/detail/algorithms/load-balance-collective.hpp:34:16)>
  ::~priority_queue((priority_queue<diy::detail::WorkInfo,_std::vector<diy::detail::WorkInfo,_std::allocator<diy::detail::WorkInfo>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_diatomic[P]diy_include_diy_detail_algorithms_load_balance_collective_hpp:34:16)>
                     *)0x25c5b3);
  return;
}

Assistant:

inline void decide_move_info(std::vector<WorkInfo>&        all_work_info,          // global work info
                      std::vector<MoveInfo>&        all_move_info)          // (output) move info for all moves
{
    all_move_info.clear();

    // move all blocks with an approximation to the longest processing time first (LPTF) scheduling algorithm
    // https://en.wikipedia.org/wiki/Longest-processing-time-first_scheduling
    // we iteratively move the heaviest block to lightest proc
    // constrained by only recording the heaviest block for each proc, not all blocks

    // minimum proc_work priority queue, top is min proc_work
    auto cmp = [&](WorkInfo& a, WorkInfo& b) { return a.proc_work > b.proc_work; };
    std::priority_queue<WorkInfo, std::vector<WorkInfo>, decltype(cmp)> min_proc_work_q(cmp);
    for (auto i = 0; i < all_work_info.size(); i++)
        min_proc_work_q.push(all_work_info[i]);

    // sort all_work_info by descending top_work
    std::sort(all_work_info.begin(), all_work_info.end(),
            [&](WorkInfo& a, WorkInfo& b) { return a.top_work > b.top_work; });

    // walk the all_work_info vector in descending top_work order
    // move the next heaviest block to the lightest proc
    for (auto i = 0; i < all_work_info.size(); i++)
    {
        auto src_work_info = all_work_info[i];                      // heaviest block
        auto dst_work_info = min_proc_work_q.top();                 // lightest proc

        // sanity check that the move makes sense
        if (src_work_info.proc_work - dst_work_info.proc_work > src_work_info.top_work &&   // improve load balance
                src_work_info.proc_rank != dst_work_info.proc_rank &&                       // not self
                src_work_info.nlids > 1)                                                    // don't leave a proc with no blocks
        {
            MoveInfo move_info;
            move_info.src_proc  = src_work_info.proc_rank;
            move_info.dst_proc  = dst_work_info.proc_rank;
            move_info.move_gid  = src_work_info.top_gid;
            all_move_info.push_back(move_info);

            // update the min_proc_work priority queue
            auto work_info = min_proc_work_q.top();                 // lightest proc
            work_info.proc_work += src_work_info.top_work;
            if (work_info.top_work < src_work_info.top_work)
            {
                work_info.top_work = src_work_info.top_work;
                work_info.top_gid  = src_work_info.top_gid;
            }
            min_proc_work_q.pop();
            min_proc_work_q.push(work_info);
        }
    }
}